

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O2

BOOL __thiscall
Js::CrossSiteObject<Js::ModuleNamespace>::SetAccessors
          (CrossSiteObject<Js::ModuleNamespace> *this,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  if (getter != (Var)0x0) {
    CrossSite::MarshalVar
              ((((((this->super_ModuleNamespace).super_DynamicObject.super_RecyclableObject.type.ptr
                  )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,getter,
               false);
  }
  if (setter != (Var)0x0) {
    CrossSite::MarshalVar
              ((((((this->super_ModuleNamespace).super_DynamicObject.super_RecyclableObject.type.ptr
                  )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,setter,
               false);
  }
  return 0;
}

Assistant:

BOOL CrossSiteObject<T>::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (getter != nullptr)
        {
            getter = CrossSite::MarshalVar(this->GetScriptContext(), getter);
        }
        if (setter != nullptr)
        {
            setter = CrossSite::MarshalVar(this->GetScriptContext(), setter);
        }
        return __super::SetAccessors(propertyId, getter, setter, flags);
    }